

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O3

bool __thiscall trun::TestRunner::ExecuteModuleTests(TestRunner *this)

{
  long lVar1;
  undefined1 uVar2;
  TestModuleExecutorBase *pTVar3;
  long *in_FS_OFFSET;
  
  lVar1 = *in_FS_OFFSET;
  if (*(char *)(lVar1 + -0x30) == '\0') {
    ExecuteModuleTests();
  }
  *(TestRunner **)(lVar1 + -0x38) = this;
  gnilk::Log::Info<char_const*>(this->pLogger,"Executing library tests");
  pTVar3 = TestModuleExecutorFactory::Create();
  uVar2 = (**(code **)(*(long *)pTVar3 + 0x10))(pTVar3,&this->library,&this->testModules);
  gnilk::Log::Info<char_const*>(this->pLogger,"Done: library tests\n\n");
  return (bool)uVar2;
}

Assistant:

bool TestRunner::ExecuteModuleTests() {
    SetCurrentTestRunner(this);
    pLogger->Info("Executing library tests");
    auto &executor = TestModuleExecutorFactory::Create();
    auto res = executor.Execute(library, testModules);
    pLogger->Info("Done: library tests\n\n");
    return res;
}